

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_boundary_methods<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>_>_>
                *matrix)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  reference pvVar4;
  undefined4 local_260;
  Dimension local_25c;
  basic_cstring<const_char> local_258;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_248;
  basic_cstring<const_char> local_220;
  basic_cstring<const_char> local_210;
  undefined4 local_200;
  Dimension local_1fc;
  basic_cstring<const_char> local_1f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1e8;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  undefined4 local_1a0;
  Dimension local_19c;
  basic_cstring<const_char> local_198;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_188;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  undefined4 local_140;
  Dimension local_13c;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_128;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  undefined4 local_e0;
  Dimension local_dc;
  basic_cstring<const_char> local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  undefined4 local_7c;
  Dimension local_78 [4];
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>_>_>
  *local_10;
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>_>_>
  *matrix_local;
  
  local_10 = matrix;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x372,&local_30);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar3,(char (*) [1])0x2d216e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>_>_>
             ::operator[](local_10,0);
    local_78[0] = Gudhi::persistence_matrix::
                  Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                  ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_7c = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_58,&local_68,0x372,1,2,local_78,"matrix[0].get_dimension()",&local_7c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_90,0x373,&local_a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c8,plVar3,(char (*) [1])0x2d216e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>_>_>
             ::operator[](local_10,1);
    local_dc = Gudhi::persistence_matrix::
               Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
               ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_e0 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c8,&local_d8,0x373,1,2,&local_dc,"matrix[1].get_dimension()",&local_e0,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_100);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f0,0x374,&local_100);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_128,plVar3,(char (*) [1])0x2d216e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>_>_>
             ::operator[](local_10,2);
    local_13c = Gudhi::persistence_matrix::
                Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_140 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_128,&local_138,0x374,1,2,&local_13c,"matrix[2].get_dimension()",&local_140,"4"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_160);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_150,0x375,&local_160);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_188,plVar3,(char (*) [1])0x2d216e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>_>_>
             ::operator[](local_10,3);
    local_19c = Gudhi::persistence_matrix::
                Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_1a0 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_188,&local_198,0x375,1,2,&local_19c,"matrix[3].get_dimension()",&local_1a0,"0"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b0,0x376,&local_1c0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1e8,plVar3,(char (*) [1])0x2d216e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>_>_>
             ::operator[](local_10,4);
    local_1fc = Gudhi::persistence_matrix::
                Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_200 = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1e8,&local_1f8,0x376,1,2,&local_1fc,"matrix[4].get_dimension()",&local_200,"3"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_220);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_210,0x377,&local_220);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_248,plVar3,(char (*) [1])0x2d216e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>_>_>
             ::operator[](local_10,5);
    local_25c = Gudhi::persistence_matrix::
                Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                ::get_dimension(&pvVar4->super_Column_dimension_option);
    local_260 = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_248,&local_258,0x377,1,2,&local_25c,"matrix[5].get_dimension()",&local_260,"4"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_248);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

void column_test_boundary_methods(std::vector<Column>& matrix) {
  BOOST_CHECK_EQUAL(matrix[0].get_dimension(), 3);
  BOOST_CHECK_EQUAL(matrix[1].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[2].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[3].get_dimension(), 0);
  BOOST_CHECK_EQUAL(matrix[4].get_dimension(), 3);
  BOOST_CHECK_EQUAL(matrix[5].get_dimension(), 4);
}